

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

void * __thiscall DataRefs::getVarAddr(DataRefs *this,dataRefsLT dr)

{
  LabelShowCfgTy *pLVar1;
  LTError *this_00;
  
  switch(dr) {
  case DR_UI_OPACITY:
    pLVar1 = (LabelShowCfgTy *)&this->UIopacity;
    break;
  case DR_UI_FONT_SCALE:
    pLVar1 = (LabelShowCfgTy *)&this->UIFontScale;
    break;
  case DR_UI_SETTINGS_TRANSP:
    pLVar1 = (LabelShowCfgTy *)&this->SUItransp;
    break;
  case DR_UI_ACI_COLLAPSED:
    pLVar1 = (LabelShowCfgTy *)&this->ACIcollapsed;
    break;
  case DR_CFG_AIRCRAFT_DISPLAYED:
    pLVar1 = (LabelShowCfgTy *)&this->bShowingAircraft;
    break;
  case DR_CFG_AUTO_START:
    pLVar1 = (LabelShowCfgTy *)&this->bAutoStart;
    break;
  case DR_CFG_MASTER_VOLUME:
    pLVar1 = (LabelShowCfgTy *)&this->volMaster;
    break;
  case DR_CFG_SND_FORCE_FMOD_INSTANCE:
    pLVar1 = (LabelShowCfgTy *)&this->sndForceFmodInstance;
    break;
  case DR_CFG_AI_ON_REQUEST:
    pLVar1 = (LabelShowCfgTy *)&this->bAIonRequest;
    break;
  default:
    if (0xc < dr - DR_CHANNEL_FUTUREDATACHN_ONLINE) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
                       ,0x2a9,"getVarAddr",logFATAL,"ASSERT FAILED: %s","NULL");
      __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
    }
    pLVar1 = (LabelShowCfgTy *)(this->bChannel + (dr - DR_CHANNEL_FUTUREDATACHN_ONLINE));
    break;
  case DR_CFG_AI_NOT_ON_GND:
    pLVar1 = (LabelShowCfgTy *)&this->bAINotOnGnd;
    break;
  case DR_CFG_LABELS:
    pLVar1 = (LabelShowCfgTy *)&this->labelCfg;
    break;
  case DR_CFG_LABEL_SHOWN:
    pLVar1 = &this->labelShown;
    break;
  case DR_CFG_LABEL_MAX_DIST:
    pLVar1 = (LabelShowCfgTy *)&this->labelMaxDist;
    break;
  case DR_CFG_LABEL_VISIBILITY_CUT_OFF:
    pLVar1 = (LabelShowCfgTy *)&this->bLabelVisibilityCUtOff;
    break;
  case DR_CFG_LABEL_FOR_PARKED:
    pLVar1 = (LabelShowCfgTy *)&this->bLabelForParked;
    break;
  case DR_CFG_LABEL_COL_DYN:
    pLVar1 = (LabelShowCfgTy *)&this->bLabelColDynamic;
    break;
  case DR_CFG_LABEL_COLOR:
    pLVar1 = (LabelShowCfgTy *)&this->labelColor;
    break;
  case DR_CFG_LOG_LEVEL:
    pLVar1 = (LabelShowCfgTy *)&this->iLogLevel;
    break;
  case DR_CFG_MSG_AREA_LEVEL:
    pLVar1 = (LabelShowCfgTy *)&this->iMsgAreaLevel;
    break;
  case DR_CFG_LOG_LIST_LEN:
    pLVar1 = (LabelShowCfgTy *)&this->logListLen;
    break;
  case DR_CFG_MAX_NUM_AC:
    pLVar1 = (LabelShowCfgTy *)&this->maxNumAc;
    break;
  case DR_CFG_FD_STD_DISTANCE:
    pLVar1 = (LabelShowCfgTy *)&this->fdStdDistance;
    break;
  case DR_CFG_FD_SNAP_TAXI_DIST:
    pLVar1 = (LabelShowCfgTy *)&this->fdSnapTaxiDist;
    break;
  case DR_CFG_FD_REFRESH_INTVL:
    pLVar1 = (LabelShowCfgTy *)&this->fdRefreshIntvl;
    break;
  case DR_CFG_FD_LONG_REFRESH_INTVL:
    pLVar1 = (LabelShowCfgTy *)&this->fdLongRefrIntvl;
    break;
  case DR_CFG_FD_BUF_PERIOD:
    pLVar1 = (LabelShowCfgTy *)&this->fdBufPeriod;
    break;
  case DR_CFG_FD_REDUCE_HEIGHT:
    pLVar1 = (LabelShowCfgTy *)&this->fdReduceHeight;
    break;
  case DR_CFG_MAX_NETW_TIMEOUT:
    pLVar1 = (LabelShowCfgTy *)&this->netwTimeoutMax;
    break;
  case DR_CFG_LND_LIGHTS_TAXI:
    pLVar1 = (LabelShowCfgTy *)&this->bLndLightsTaxi;
    break;
  case DR_CFG_HIDE_BELOW_AGL:
    pLVar1 = (LabelShowCfgTy *)&this->hideBelowAGL;
    break;
  case DR_CFG_HIDE_TAXIING:
    pLVar1 = (LabelShowCfgTy *)&this->hideTaxiing;
    break;
  case DR_CFG_HIDE_PARKING:
    pLVar1 = (LabelShowCfgTy *)&this->hideParking;
    break;
  case DR_CFG_HIDE_NEARBY_GND:
    pLVar1 = (LabelShowCfgTy *)&this->hideNearbyGnd;
    break;
  case DR_CFG_HIDE_NEARBY_AIR:
    pLVar1 = (LabelShowCfgTy *)&this->hideNearbyAir;
    break;
  case DR_CFG_HIDE_IN_REPLAY:
    pLVar1 = (LabelShowCfgTy *)&this->hideInReplay;
    break;
  case DR_CFG_HIDE_STATIC_TWR:
    pLVar1 = (LabelShowCfgTy *)&this->hideStaticTwr;
    break;
  case DR_CFG_COPY_OBJ_FILES:
    pLVar1 = (LabelShowCfgTy *)&this->cpyObjFiles;
    break;
  case DR_CFG_CONTRAIL_MIN_ALT:
    pLVar1 = (LabelShowCfgTy *)&this->contrailAltMin_ft;
    break;
  case DR_CFG_CONTRAIL_MAX_ALT:
    pLVar1 = (LabelShowCfgTy *)&this->contrailAltMax_ft;
    break;
  case DR_CFG_CONTRAIL_LIFE_TIME:
    pLVar1 = (LabelShowCfgTy *)&this->contrailLifeTime;
    break;
  case DR_CFG_CONTRAIL_MULTIPLE:
    pLVar1 = (LabelShowCfgTy *)&this->contrailMulti;
    break;
  case DR_CFG_WEATHER_CONTROL:
    pLVar1 = (LabelShowCfgTy *)&this->weatherCtl;
    break;
  case DR_CFG_WEATHER_MAX_METAR_AGL:
    pLVar1 = (LabelShowCfgTy *)&this->weatherMaxMETARheight_ft;
    break;
  case DR_CFG_WEATHER_MAX_METAR_DIST:
    pLVar1 = (LabelShowCfgTy *)&this->weatherMaxMETARdist_nm;
    break;
  case DR_CFG_REMOTE_SUPPORT:
    pLVar1 = (LabelShowCfgTy *)&this->remoteSupport;
    break;
  case DR_CFG_EXTERNAL_CAMERA:
    pLVar1 = (LabelShowCfgTy *)&this->bUseExternalCamera;
    break;
  case DR_CFG_LAST_CHECK_NEW_VER:
    pLVar1 = (LabelShowCfgTy *)&this->lastCheckNewVer;
    break;
  case DR_DBG_AC_FILTER:
    pLVar1 = (LabelShowCfgTy *)&this->uDebugAcFilter;
    break;
  case DR_DBG_AC_POS:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugAcPos;
    break;
  case DR_DBG_LOG_RAW_FD:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugLogRawFd;
    break;
  case DR_DBG_LOG_WEATHER:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugWeather;
    break;
  case DR_DBG_MODEL_MATCHING:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugModelMatching;
    break;
  case DR_DBG_EXPORT_FD:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugExportFd;
    break;
  case DR_DBG_EXPORT_USER_AC:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugExportUserAc;
    break;
  case DR_DBG_EXPORT_NORMALIZE_TS:
    pLVar1 = (LabelShowCfgTy *)&this->bDebugExportNormTS;
    break;
  case DR_DBG_EXPORT_FORMAT:
    pLVar1 = (LabelShowCfgTy *)&this->eDebugExportFdFormat;
    break;
  case DR_CFG_FSC_ENV:
    pLVar1 = (LabelShowCfgTy *)&this->fscEnv;
    break;
  case DR_CFG_OGN_USE_REQUREPL:
    pLVar1 = (LabelShowCfgTy *)&this->ognUseRequRepl;
    break;
  case DR_CFG_RT_LISTEN_PORT:
    pLVar1 = (LabelShowCfgTy *)&this->rtListenPort;
    break;
  case DR_CFG_RT_TRAFFIC_PORT:
    pLVar1 = (LabelShowCfgTy *)&this->rtTrafficPort;
    break;
  case DR_CFG_RT_WEATHER_PORT:
    pLVar1 = (LabelShowCfgTy *)&this->rtWeatherPort;
    break;
  case DR_CFG_RT_SIM_TIME_CTRL:
    pLVar1 = (LabelShowCfgTy *)&this->rtSTC;
    break;
  case DR_CFG_RT_MAN_TOFFSET:
    pLVar1 = (LabelShowCfgTy *)&this->rtManTOfs;
    break;
  case DR_CFG_RT_CONNECT_TYPE:
    pLVar1 = (LabelShowCfgTy *)&this->rtConnType;
    break;
  case DR_CFG_FF_LISTEN_PORT:
    pLVar1 = (LabelShowCfgTy *)&this->ffListenPort;
    break;
  case DR_CFG_FF_SEND_PORT:
    pLVar1 = (LabelShowCfgTy *)&this->ffSendPort;
    break;
  case DR_CFG_FF_SEND_USER_PLANE:
    pLVar1 = (LabelShowCfgTy *)&this->bffUserPlane;
    break;
  case DR_CFG_FF_SEND_TRAFFIC:
    pLVar1 = (LabelShowCfgTy *)&this->bffTraffic;
    break;
  case DR_CFG_FF_SEND_TRAFFIC_INTVL:
    pLVar1 = (LabelShowCfgTy *)&this->ffSendTrfcIntvl;
  }
  return pLVar1;
}

Assistant:

void* DataRefs::getVarAddr (dataRefsLT dr)
{
    switch (dr) {
        // UI information
        case DR_UI_OPACITY:                 return &UIopacity;
        case DR_UI_FONT_SCALE:              return &UIFontScale;
        case DR_UI_SETTINGS_TRANSP:         return &SUItransp;
        case DR_UI_ACI_COLLAPSED:           return &ACIcollapsed;

        // configuration options
        case DR_CFG_AIRCRAFT_DISPLAYED:     return &bShowingAircraft;
        case DR_CFG_AUTO_START:             return &bAutoStart;
        case DR_CFG_MASTER_VOLUME:          return &volMaster;
        case DR_CFG_SND_FORCE_FMOD_INSTANCE:return &sndForceFmodInstance;
        case DR_CFG_AI_ON_REQUEST:          return &bAIonRequest;
        case DR_CFG_AI_NOT_ON_GND:          return &bAINotOnGnd;
        case DR_CFG_LABELS:                 return &labelCfg;
        case DR_CFG_LABEL_SHOWN:            return &labelShown;
        case DR_CFG_LABEL_MAX_DIST:         return &labelMaxDist;
        case DR_CFG_LABEL_VISIBILITY_CUT_OFF: return &bLabelVisibilityCUtOff;
        case DR_CFG_LABEL_FOR_PARKED:       return &bLabelForParked;
        case DR_CFG_LABEL_COL_DYN:          return &bLabelColDynamic;
        case DR_CFG_LABEL_COLOR:            return &labelColor;
        case DR_CFG_LOG_LEVEL:              return &iLogLevel;
        case DR_CFG_MSG_AREA_LEVEL:         return &iMsgAreaLevel;
        case DR_CFG_LOG_LIST_LEN:           return &logListLen;
        case DR_CFG_MAX_NUM_AC:             return &maxNumAc;
        case DR_CFG_FD_STD_DISTANCE:        return &fdStdDistance;
        case DR_CFG_FD_SNAP_TAXI_DIST:      return &fdSnapTaxiDist;
        case DR_CFG_FD_REFRESH_INTVL:       return &fdRefreshIntvl;
        case DR_CFG_FD_LONG_REFRESH_INTVL:  return &fdLongRefrIntvl;
        case DR_CFG_FD_BUF_PERIOD:          return &fdBufPeriod;
        case DR_CFG_FD_REDUCE_HEIGHT:       return &fdReduceHeight;
        case DR_CFG_MAX_NETW_TIMEOUT:       return &netwTimeoutMax;
        case DR_CFG_LND_LIGHTS_TAXI:        return &bLndLightsTaxi;
        case DR_CFG_HIDE_BELOW_AGL:         return &hideBelowAGL;
        case DR_CFG_HIDE_TAXIING:           return &hideTaxiing;
        case DR_CFG_HIDE_PARKING:           return &hideParking;
        case DR_CFG_HIDE_NEARBY_GND:        return &hideNearbyGnd;
        case DR_CFG_HIDE_NEARBY_AIR:        return &hideNearbyAir;
        case DR_CFG_HIDE_IN_REPLAY:         return &hideInReplay;
        case DR_CFG_HIDE_STATIC_TWR:        return &hideStaticTwr;
        case DR_CFG_COPY_OBJ_FILES:         return &cpyObjFiles;
        case DR_CFG_CONTRAIL_MIN_ALT:       return &contrailAltMin_ft;
        case DR_CFG_CONTRAIL_MAX_ALT:       return &contrailAltMax_ft;
        case DR_CFG_CONTRAIL_LIFE_TIME:     return &contrailLifeTime;
        case DR_CFG_CONTRAIL_MULTIPLE:      return &contrailMulti;
        case DR_CFG_WEATHER_CONTROL:        return &weatherCtl;
        case DR_CFG_WEATHER_MAX_METAR_AGL:  return &weatherMaxMETARheight_ft;
        case DR_CFG_WEATHER_MAX_METAR_DIST: return &weatherMaxMETARdist_nm;
        case DR_CFG_REMOTE_SUPPORT:         return &remoteSupport;
        case DR_CFG_EXTERNAL_CAMERA:        return &bUseExternalCamera;
        case DR_CFG_LAST_CHECK_NEW_VER:     return &lastCheckNewVer;

        // debug options
        case DR_DBG_AC_FILTER:              return &uDebugAcFilter;
        case DR_DBG_AC_POS:                 return &bDebugAcPos;
        case DR_DBG_LOG_RAW_FD:             return &bDebugLogRawFd;
        case DR_DBG_LOG_WEATHER:            return &bDebugWeather;
        case DR_DBG_MODEL_MATCHING:         return &bDebugModelMatching;
        case DR_DBG_EXPORT_FD:              return &bDebugExportFd;
        case DR_DBG_EXPORT_USER_AC:         return &bDebugExportUserAc;
        case DR_DBG_EXPORT_NORMALIZE_TS:    return &bDebugExportNormTS;
        case DR_DBG_EXPORT_FORMAT:          return &eDebugExportFdFormat;

        // channel configuration options
        case DR_CFG_FSC_ENV:                return &fscEnv;
        case DR_CFG_OGN_USE_REQUREPL:       return &ognUseRequRepl;
        case DR_CFG_RT_LISTEN_PORT:         return &rtListenPort;
        case DR_CFG_RT_TRAFFIC_PORT:        return &rtTrafficPort;
        case DR_CFG_RT_WEATHER_PORT:        return &rtWeatherPort;
        case DR_CFG_RT_SIM_TIME_CTRL:       return &rtSTC;
        case DR_CFG_RT_MAN_TOFFSET:         return &rtManTOfs;
        case DR_CFG_RT_CONNECT_TYPE:        return &rtConnType;
        case DR_CFG_FF_LISTEN_PORT:         return &ffListenPort;
        case DR_CFG_FF_SEND_PORT:           return &ffSendPort;
        case DR_CFG_FF_SEND_USER_PLANE:     return &bffUserPlane;
        case DR_CFG_FF_SEND_TRAFFIC:        return &bffTraffic;
        case DR_CFG_FF_SEND_TRAFFIC_INTVL:  return &ffSendTrfcIntvl;

        default:
            // flight channels
            if (DR_CHANNEL_FIRST <= dr && dr <= DR_CHANNEL_LAST)
                return &bChannel[dr-DR_CHANNEL_FIRST];
            
            // else: must not happen
            LOG_ASSERT(NULL);
            return NULL;
    }
}